

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

char * google::protobuf::FastHex32ToBuffer(uint32 value,char *buffer)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)value;
  buffer[8] = '\0';
  uVar2 = 9;
  do {
    buffer[uVar2 - 2] = "0123456789abcdef"[(uint)uVar1 & 0xf];
    uVar1 = uVar1 >> 4;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  return buffer;
}

Assistant:

char *FastHex32ToBuffer(uint32 value, char* buffer) {
  return InternalFastHexToBuffer(value, buffer, 8);
}